

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O0

void glist_selectall(_glist *x)

{
  _gobj *p_Var1;
  t_selection *sel2;
  t_gobj *y;
  t_selection *sel;
  _glist *x_local;
  
  if ((x->gl_editor != (t_editor *)0x0) && (glist_noselect(x), x->gl_list != (t_gobj *)0x0)) {
    y = (t_gobj *)getbytes(0x10);
    sel2 = (t_selection *)x->gl_list;
    x->gl_editor->e_selection = (t_selection *)y;
    y->g_pd = (t_pd)sel2;
    gobj_select((t_gobj *)sel2,x,1);
    while (sel2 = sel2->sel_next, (t_pd)sel2 != (t_pd)0x0) {
      p_Var1 = (_gobj *)getbytes(0x10);
      y->g_next = p_Var1;
      p_Var1->g_pd = (t_pd)sel2;
      gobj_select((t_gobj *)sel2,x,1);
      y = p_Var1;
    }
    y->g_next = (_gobj *)0x0;
  }
  return;
}

Assistant:

void glist_selectall(t_glist *x)
{
    if (x->gl_editor)
    {
        glist_noselect(x);
        if (x->gl_list)
        {
            t_selection *sel = (t_selection *)getbytes(sizeof(*sel));
            t_gobj *y = x->gl_list;
            x->gl_editor->e_selection = sel;
            sel->sel_what = y;
            gobj_select(y, x, 1);
            while ((y = y->g_next))
            {
                t_selection *sel2 = (t_selection *)getbytes(sizeof(*sel2));
                sel->sel_next = sel2;
                sel = sel2;
                sel->sel_what = y;
                gobj_select(y, x, 1);
            }
            sel->sel_next = 0;
        }
    }
}